

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

string * __thiscall
Jupiter::Socket::resolveAddress_abi_cxx11_
          (string *__return_storage_ptr__,Socket *this,addrinfo *addr,uint result)

{
  int iVar1;
  
  if ((int)addr != 0 && this != (Socket *)0x0) {
    addr = (addrinfo *)(ulong)((int)addr - 1);
    do {
      this = (Socket *)((Socket *)&((Data *)this)->remote_host)->m_data;
      iVar1 = (int)addr;
      addr = (addrinfo *)(ulong)(iVar1 - 1);
      if ((Data *)this == (Data *)0x0) break;
    } while (iVar1 != 0);
  }
  if ((Data *)this == (Data *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    resolveAddress_abi_cxx11_(__return_storage_ptr__,this,addr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::resolveAddress(addrinfo *addr, unsigned int result) { // static
	addrinfo *ptr = Jupiter::Socket::getAddrInfo(addr, result);
	if (ptr == nullptr) {
		return {};
	}

	return Jupiter::Socket::resolveAddress(ptr);
}